

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_profile.c
# Opt level: O0

char * nextVis(char *ptr,char *cont)

{
  char cVar1;
  char cVar2;
  ushort **ppuVar3;
  bool bVar4;
  char *local_20;
  char *cont_local;
  char *ptr_local;
  
  local_20 = cont;
  cont_local = ptr;
  if (cont == (char *)0x0) {
    ptr_local = ptr;
    if (*ptr != '\0') {
      ppuVar3 = __ctype_b_loc();
      if ((((*ppuVar3)[(int)*ptr] & 0x2000) == 0) && (*ptr != ':')) {
        ptr_local = (char *)0x0;
      }
      else {
        cont_local = ptr + 1;
LAB_0010de8f:
        while( true ) {
          bVar4 = false;
          if (*cont_local != '\0') {
            ppuVar3 = __ctype_b_loc();
            bVar4 = ((*ppuVar3)[(int)*cont_local] & 0x2000) != 0;
          }
          if (!bVar4) break;
          cont_local = cont_local + 1;
        }
        if ((*cont_local != '\0') && (*cont_local == ':')) {
          do {
            cont_local = cont_local + 1;
            bVar4 = false;
            if (*cont_local != '\0') {
              ppuVar3 = __ctype_b_loc();
              bVar4 = ((*ppuVar3)[(int)*cont_local] & 0x2000) != 0;
            }
          } while (bVar4);
        }
        ptr_local = cont_local;
      }
    }
  }
  else {
    do {
      if ((((*local_20 == '\0') || (*cont_local == '\0')) ||
          (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*cont_local] & 0x2000) != 0)) ||
         (*cont_local == ':')) goto LAB_0010de8f;
      cVar1 = *cont_local;
      cVar2 = *local_20;
      local_20 = local_20 + 1;
      cont_local = cont_local + 1;
    } while (cVar1 == cVar2);
    ptr_local = (char *)0x0;
  }
  return ptr_local;
}

Assistant:

static const char *nextVis(const char *ptr, const char *cont)
{
	if (cont) {
		while (*cont) {
			if (!*ptr || (isspace(*ptr) || *ptr == ':')) {
				break;
			}
			if (*ptr++ != *cont++) {
				return 0;
			}
		}
	}
	else {
		if (!*ptr) {
			return ptr;
		}
		if (!isspace(*ptr) && *ptr != ':') {
			return 0;
		}
		++ptr;
	}
	while (*ptr && isspace(*ptr)) ++ptr;
	if (*ptr && *ptr == ':') {
		++ptr;
		while (*ptr && isspace(*ptr)) ++ptr;
	}
	return ptr;
}